

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          uint num_digits,string_view prefix,basic_format_specs<char> *spec,dec_writer f)

{
  ulong uVar1;
  alignment aVar2;
  int iVar3;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<char,_fmt::v5::basic_format_specs<char>_>::dec_writer>
  f_00;
  ulong uVar4;
  ulong size;
  undefined1 uVar5;
  long lVar6;
  align_spec as;
  undefined7 uStack_37;
  
  uVar1 = (ulong)num_digits + prefix.size_;
  uVar5 = (undefined1)(spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_NUMERIC) {
    uVar4 = (ulong)(spec->super_align_spec).width_;
    size = uVar4;
    if (uVar4 < uVar1) {
      size = uVar1;
    }
    lVar6 = 0;
    if (uVar1 <= uVar4) {
      lVar6 = uVar4 - uVar1;
    }
    as.align_ = (spec->super_align_spec).align_;
    as.width_ = (spec->super_align_spec).width_;
    as.fill_ = (spec->super_align_spec).fill_;
  }
  else {
    iVar3 = spec->precision_;
    lVar6 = 0;
    size = uVar1;
    if ((int)num_digits < iVar3) {
      size = (long)iVar3 + prefix.size_;
    }
    if ((int)num_digits < iVar3) {
      lVar6 = (long)iVar3 - (ulong)num_digits;
      uVar5 = 0x30;
    }
    as.align_ = (spec->super_align_spec).align_;
    as.width_ = (spec->super_align_spec).width_;
    as.fill_ = (spec->super_align_spec).fill_;
    if (aVar2 == ALIGN_DEFAULT) {
      as.align_ = ALIGN_RIGHT;
    }
  }
  f_00._17_7_ = uStack_37;
  f_00.fill = uVar5;
  f_00.prefix = prefix;
  f_00.padding = lVar6;
  f_00.f = f;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>>
            (this,size,&as,f_00);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }